

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::expectProgramValue
          (GeometryProgramQueryCase *this,deUint32 program,int value)

{
  GLenum GVar1;
  code *pcVar2;
  deUint32 dVar3;
  qpTestResult qVar4;
  RenderContext *pRVar5;
  int extraout_var;
  int *piVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  Enum<int,_2UL> EVar9;
  MessageBuilder local_360;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1c0;
  MessageBuilder local_1b0;
  undefined1 local_2c [8];
  StateQueryMemoryWriteGuard<int> state;
  Functions *gl;
  int value_local;
  deUint32 program_local;
  GeometryProgramQueryCase *this_local;
  
  gl._0_4_ = value;
  gl._4_4_ = program;
  _value_local = this;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  state.m_value = (*pRVar5->_vptr_RenderContext[3])();
  state.m_postguard = extraout_var;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_2c);
  dVar3 = gl._4_4_;
  pcVar2 = *(code **)(state._4_8_ + 0x9d8);
  GVar1 = this->m_target;
  piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_2c);
  (*pcVar2)(dVar3,GVar1,piVar6);
  dVar3 = (**(code **)(state._4_8_ + 0x800))();
  glu::checkError(dVar3,"getProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0xfd6);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  EVar9 = glu::getProgramParamStr(this->m_target);
  local_1e0 = EVar9.m_getName;
  local_1d8 = EVar9.m_value;
  local_1c0.m_getName = local_1e0;
  local_1c0.m_value = local_1d8;
  pMVar8 = tcu::MessageBuilder::operator<<(&local_1b0,&local_1c0);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])0x2bdb312);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(StateQueryMemoryWriteGuard<int> *)local_2c);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                     ((StateQueryMemoryWriteGuard *)local_2c);
  if (*piVar6 != (int)gl) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_360,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [20])"// ERROR: Expected ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&gl);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [7])0x2c59494);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(StateQueryMemoryWriteGuard<int> *)local_2c);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
    qVar4 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar4 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "got invalid value");
    }
  }
  return;
}

Assistant:

void GeometryProgramQueryCase::expectProgramValue (deUint32 program, int value)
{
	const glw::Functions&										gl		= m_context.getRenderContext().getFunctions();
	gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>	state;

	gl.getProgramiv(program, m_target, &state);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramiv");

	m_testCtx.getLog() << tcu::TestLog::Message << glu::getProgramParamStr(m_target) << " = " << state << tcu::TestLog::EndMessage;

	if (state != value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: Expected " << value << ", got " << state << tcu::TestLog::EndMessage;

		// don't overwrite error
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
	}
}